

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O3

bool __thiscall PDA::evaluate(PDA *this,string *s)

{
  char input;
  State *pSVar1;
  size_type sVar2;
  bool bVar3;
  size_type sVar4;
  PDA *this_00;
  initializer_list<EvaluationState> __l;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  stack;
  allocator_type local_1a9;
  undefined1 local_1a8 [112];
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_138;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_118;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_100;
  EvaluationState local_e8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_1a8._16_8_ = (pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_88,0);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88,&this->startStackZ0);
  pSVar1 = this->startState;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_e8,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_88);
  __l._M_len = 1;
  __l._M_array = &local_e8;
  local_e8.currentStates = pSVar1;
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_1a8 + 0x58),__l,
             &local_1a9);
  local_1a8._24_8_ = this;
  eclose(&local_138,this,
         (vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_1a8 + 0x58));
  local_1a8._48_8_ = local_1a8._16_8_;
  local_1a8._40_8_ = local_1a8._8_8_;
  local_1a8._32_8_ = local_1a8._0_8_;
  local_1a8._16_8_ =
       local_138.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1a8._0_8_ =
       local_138.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_138.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_138.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_1a8 + 0x20));
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_138);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_1a8 + 0x58));
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_e8);
  sVar2 = s->_M_string_length;
  if (sVar2 != 0) {
    local_1a8._56_8_ = (s->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      input = *(char *)((long)&((_Alloc_hider *)local_1a8._56_8_)->_M_p + sVar4);
      this_00 = (PDA *)local_1a8;
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
                (&local_118,(vector<EvaluationState,_std::allocator<EvaluationState>_> *)this_00);
      nextEvaluations(&local_100,this_00,&local_118,input);
      eclose((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_1a8 + 0x20),
             (PDA *)local_1a8._24_8_,&local_100);
      local_e8.stack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)local_1a8._16_8_;
      local_e8.stack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size = local_1a8._8_8_;
      local_e8.stack.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)local_1a8._0_8_;
      local_1a8._16_8_ = local_1a8._48_8_;
      local_1a8._0_8_ = local_1a8._32_8_;
      local_1a8._8_8_ = local_1a8._40_8_;
      local_1a8._32_8_ = (pointer)0x0;
      local_1a8._40_8_ = (pointer)0x0;
      local_1a8._48_8_ = (pointer)0x0;
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
                ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&local_e8);
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
                ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_1a8 + 0x20));
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_100);
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_118);
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_1a8 + 0x40),
             (vector<EvaluationState,_std::allocator<EvaluationState>_> *)local_1a8);
  bVar3 = containsEndState((PDA *)local_1a8._24_8_,
                           (vector<EvaluationState,_std::allocator<EvaluationState>_> *)
                           (local_1a8 + 0x40));
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)(local_1a8 + 0x40));
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
            ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)local_1a8);
  return bVar3;
}

Assistant:

bool PDA::evaluate(std::string s) {

    std::vector<EvaluationState> evaluations;

    std::stack<std::string> stack;
    stack.push(startStackZ0);

    evaluations = eclose({EvaluationState(stack, startState)});

    for (char c: s) {
        evaluations = eclose(nextEvaluations(evaluations, c));
    }

    return containsEndState(evaluations);
}